

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closed_file_input_source.cc
# Opt level: O3

int main(void)

{
  ClosedFileInputSource cf2;
  FileInputSource f;
  ClosedFileInputSource cf;
  ClosedFileInputSource local_2b0;
  FileInputSource local_1c8;
  ClosedFileInputSource local_f0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testing with ClosedFileInputSource\n",0x23);
  ClosedFileInputSource::ClosedFileInputSource(&local_f0,"input");
  do_tests(&local_f0.super_InputSource);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testing with ClosedFileInputSource in stay open mode\n",0x35);
  ClosedFileInputSource::ClosedFileInputSource(&local_2b0,"input");
  ClosedFileInputSource::stayOpen(&local_2b0,true);
  do_tests(&local_2b0.super_InputSource);
  ClosedFileInputSource::stayOpen(&local_2b0,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testing with FileInputSource\n",0x1d);
  FileInputSource::FileInputSource(&local_1c8,"input");
  do_tests(&local_1c8.super_InputSource);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"all assertions passed",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  FileInputSource::~FileInputSource(&local_1c8);
  ClosedFileInputSource::~ClosedFileInputSource(&local_2b0);
  ClosedFileInputSource::~ClosedFileInputSource(&local_f0);
  return 0;
}

Assistant:

int
main()
{
    // This test is designed to work with a specified input file.
    std::cout << "testing with ClosedFileInputSource\n";
    ClosedFileInputSource cf("input");
    do_tests(&cf);
    std::cout << "testing with ClosedFileInputSource in stay open mode\n";
    ClosedFileInputSource cf2("input");
    cf2.stayOpen(true);
    do_tests(&cf2);
    cf2.stayOpen(false);
    std::cout << "testing with FileInputSource\n";
    FileInputSource f("input");
    do_tests(&f);
    std::cout << "all assertions passed" << std::endl;
    return 0;
}